

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void connect1_cb(uv_connect_t *req,int status)

{
  uv_stream_t *handle;
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t local_20;
  
  handle = connect_req.handle;
  if (req == &connect_req) {
    if (status == 0) {
      connect_cb_called = connect_cb_called + 1;
      loop = uv_default_loop();
      iVar1 = uv_timer_init(loop,&tm);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
        if (iVar1 == 0) {
          local_20 = uv_buf_init("P",1);
          iVar1 = uv_write(&write_req,handle,&local_20,1,write1_cb);
          if (iVar1 == 0) {
            iVar1 = uv_read_start(handle,alloc_cb,read1_cb);
            if (iVar1 == 0) {
              return;
            }
            pcVar3 = "r == 0";
            uVar2 = 0xe8;
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0xe4;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xe0;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xdd;
      }
    }
    else {
      pcVar3 = "status == 0";
      uVar2 = 0xd7;
    }
  }
  else {
    pcVar3 = "req == &connect_req";
    uVar2 = 0xd6;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-open.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void connect1_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;
  uv_stream_t* stream;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  stream = req->handle;
  connect_cb_called++;

  r = uv_timer_init(uv_default_loop(), &tm);
  ASSERT(r == 0);

  r = uv_timer_start(&tm, timer_cb, 2000, 0);
  ASSERT(r == 0);

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, stream, &buf, 1, write1_cb);
  ASSERT(r == 0);

  /* Start reading */
  r = uv_read_start(stream, alloc_cb, read1_cb);
  ASSERT(r == 0);
}